

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SigmaStarAbstract.h
# Opt level: O0

DFA<covenant::Sym> * __thiscall
covenant::SigmaStarAbstract<covenant::Sym>::do_abstraction
          (SigmaStarAbstract<covenant::Sym> *this,CFG *g,bool is_regular)

{
  State s;
  size_type sVar1;
  string *msg;
  byte in_CL;
  socklen_t *__addr_len;
  long in_RDX;
  sockaddr *__addr;
  DFA<covenant::Sym> *in_RDI;
  bool bVar2;
  uint in_stack_00000020;
  uint in_stack_00000024;
  DFA<covenant::Sym> *in_stack_00000028;
  bool is_not_empty;
  DFA<covenant::Sym> dfa;
  int i;
  State q0;
  CFG *in_stack_00000168;
  StronglyRegularToFA<covenant::Sym> *in_stack_00000170;
  StronglyRegularToFA<covenant::Sym> conv;
  DFA<covenant::Sym> sfa;
  DFA<covenant::Sym> *min_dfa;
  CFG *in_stack_fffffffffffffb18;
  StronglyRegularToFA<covenant::Sym> *in_stack_fffffffffffffb20;
  allocator *this_00;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb30;
  DFA<covenant::Sym> *this_01;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  uint uVar3;
  CFG *in_stack_fffffffffffffb40;
  bool local_4aa;
  DFA<covenant::Sym> *val;
  DFA<covenant::Sym> *this_02;
  undefined1 *puVar4;
  allocator local_471;
  string local_470 [4];
  int in_stack_fffffffffffffb94;
  DFA<covenant::Sym> *in_stack_fffffffffffffb98;
  StronglyRegularToFA<covenant::Sym> *in_stack_fffffffffffffbd8;
  int local_3cc;
  allocator local_3b1;
  string local_3b0 [32];
  DFA<covenant::Sym> *in_stack_fffffffffffffc70;
  DFA<covenant::Sym> *in_stack_fffffffffffffcb8;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  DFA<covenant::Sym> *in_stack_ffffffffffffff08;
  allocator local_d1;
  string local_d0 [48];
  undefined1 local_a0 [16];
  DFA<covenant::Sym> local_90;
  byte local_19;
  long local_18;
  
  local_19 = in_CL & 1;
  puVar4 = local_a0;
  val = in_RDI;
  this_02 = in_RDI;
  local_18 = in_RDX;
  CFG::getTermFactory(in_stack_fffffffffffffb18);
  DFA<covenant::Sym>::DFA
            ((DFA<covenant::Sym> *)in_stack_fffffffffffffb20,
             (TermFactory *)in_stack_fffffffffffffb18);
  boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
            ((shared_ptr<covenant::TerminalFactory> *)0x21c202);
  if ((local_19 & 1) == 0) {
    __addr_len = (socklen_t *)CONCAT71((int7)((ulong)in_RDI >> 8),avy::AvyLogFlag);
    bVar2 = (avy::AvyLogFlag & 1) != 0;
    local_4aa = false;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b0,"verbose",&local_3b1);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(in_stack_fffffffffffffb30,
                      (key_type *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
      local_4aa = sVar1 != 0;
    }
    uVar3 = (uint)local_4aa << 0x18;
    if (bVar2) {
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    }
    if ((uVar3 & 0x1000000) != 0) {
      std::operator<<((ostream *)&std::cout,"Applied Sigma* abstraction.\n");
    }
    s = DFA<covenant::Sym>::state(in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
    this_01 = &local_90;
    DFA<covenant::Sym>::setStart(this_01,s);
    DFA<covenant::Sym>::accept(this_01,s.id,__addr,__addr_len);
    DFA<covenant::Sym>::eps_transition
              ((DFA<covenant::Sym> *)in_stack_fffffffffffffb18,
               (State)(uint)((ulong)in_stack_fffffffffffffb20 >> 0x20),
               (State)(uint)in_stack_fffffffffffffb20);
    for (local_3cc = *(int *)(local_18 + 0x34);
        local_3cc < *(int *)(local_18 + 0x34) + *(int *)(local_18 + 0x30); local_3cc = local_3cc + 1
        ) {
      Sym::mkTerm(local_3cc);
      DFA<covenant::Sym>::transition
                (this_02,(State)(uint)((ulong)puVar4 >> 0x20),(Sym *)val,(State)(uint)puVar4);
    }
  }
  else {
    bVar2 = false;
    if ((avy::AvyLogFlag & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"verbose",&local_d1);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(in_stack_fffffffffffffb30,
                      (key_type *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28));
      bVar2 = sVar1 != 0;
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    if (bVar2) {
      std::operator<<((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n");
    }
    CFG::CFG(in_stack_fffffffffffffb40,
             (CFG *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA(in_stack_00000170,in_stack_00000168);
    CFG::~CFG(&in_stack_fffffffffffffb20->g);
    StronglyRegularToFA<covenant::Sym>::make_fa(in_stack_fffffffffffffbd8);
    DFA<covenant::Sym>::operator=
              ((DFA<covenant::Sym> *)in_stack_fffffffffffffb20,
               (DFA<covenant::Sym> *)in_stack_fffffffffffffb18);
    DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffffb20);
    StronglyRegularToFA<covenant::Sym>::~StronglyRegularToFA(in_stack_fffffffffffffb20);
  }
  DFA<covenant::Sym>::eps_elim(in_stack_fffffffffffffc70);
  DFA<covenant::Sym>::makeDFA(in_stack_00000028,in_stack_00000024,in_stack_00000020);
  DFA<covenant::Sym>::minimize
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
  bVar2 = DFA<covenant::Sym>::eliminateDeadStates(in_stack_fffffffffffffcb8);
  if (!bVar2) {
    msg = (string *)__cxa_allocate_exception(0x20);
    this_00 = &local_471;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_470,"One CFG is trivially empty.\n======\nUNSAT\n======",this_00);
    Exit::Exit((Exit *)this_00,msg);
    __cxa_throw(msg,&Exit::typeinfo,Exit::~Exit);
  }
  DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffffb20);
  DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffffb20);
  return this_02;
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG("verbose", cout << "The CFG is regular thus no need to abstract.\n");
      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG("verbose", cout << "Applied Sigma* abstraction.\n");
      State q0 = sfa.state(0);
      sfa.setStart(q0);
      sfa.accept(q0);
      sfa.eps_transition(q0,q0); 
      for (int i=g.alphstart; i<g.alphstart+g.alphsz; i++)
      {
        sfa.transition(q0,EdgeSym::mkTerm(i), q0);
      }
    }

    sfa.eps_elim();
    DFA<EdgeSym> dfa     = sfa.makeDFA(g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize(g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
    }
    
    return min_dfa;
  }